

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit.cpp
# Opt level: O3

SinkCombineResultType __thiscall
duckdb::PhysicalLimit::Combine
          (PhysicalLimit *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  GlobalSinkState *pGVar1;
  LocalSinkState *pLVar2;
  int iVar3;
  __pthread_internal_list *p_Var4;
  
  pGVar1 = input->global_state;
  pLVar2 = input->local_state;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(pGVar1 + 1));
  if (iVar3 == 0) {
    if (pLVar2[1].partition_info.batch_index.index != 0xffffffffffffffff) {
      p_Var4 = (__pthread_internal_list *)
               optional_idx::GetIndex(&pLVar2[1].partition_info.batch_index);
      pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.__prev
           = p_Var4;
    }
    if (pLVar2[1].partition_info.min_batch_index.index != 0xffffffffffffffff) {
      p_Var4 = (__pthread_internal_list *)
               optional_idx::GetIndex(&pLVar2[1].partition_info.min_batch_index);
      pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.__next
           = p_Var4;
    }
    BatchedDataCollection::Merge
              ((BatchedDataCollection *)&pGVar1[1].super_StateWithBlockableTasks.blocked_tasks,
               (BatchedDataCollection *)&pLVar2[1].partition_info.partition_data);
    pthread_mutex_unlock((pthread_mutex_t *)(pGVar1 + 1));
    return FINISHED;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

SinkCombineResultType PhysicalLimit::Combine(ExecutionContext &context, OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<LimitGlobalState>();
	auto &state = input.local_state.Cast<LimitLocalState>();

	lock_guard<mutex> lock(gstate.glock);
	if (state.limit.IsValid()) {
		gstate.limit = state.limit.GetIndex();
	}
	if (state.offset.IsValid()) {
		gstate.offset = state.offset.GetIndex();
	}
	gstate.data.Merge(state.data);

	return SinkCombineResultType::FINISHED;
}